

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# var_mir_fold.hpp
# Opt level: O1

void __thiscall
optimization::var_mir_fold::VarMirFold::optimize_mir
          (VarMirFold *this,MirPackage *package,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
          *extra_data_repo)

{
  _Rb_tree_node_base *p_Var1;
  
  for (p_Var1 = (package->functions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(package->functions)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    if (*(char *)&p_Var1[3]._M_parent[1]._M_left == '\0') {
      optimize_func(this,(string *)(p_Var1 + 1),(MirFunction *)(p_Var1 + 2));
    }
  }
  return;
}

Assistant:

void optimize_mir(mir::inst::MirPackage& package,
                    std::map<std::string, std::any>& extra_data_repo) {
    for (auto& i : package.functions) {
      if (!i.second.type->is_extern) {
        optimize_func(i.first, i.second);
      }
    }
  }